

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.h
# Opt level: O1

void __thiscall jbcoin::STInteger<unsigned_char>::add(STInteger<unsigned_char> *this,Serializer *s)

{
  SerializedTypeID SVar1;
  SField *pSVar2;
  SerializedTypeID SVar3;
  
  pSVar2 = (this->super_STBase).fName;
  if (0xff < pSVar2->fieldValue) {
    __assert_fail("fName->isBinary ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STInteger.h"
                  ,0x45,"virtual void jbcoin::STInteger<unsigned char>::add(Serializer &) const");
  }
  SVar1 = pSVar2->fieldType;
  SVar3 = (*(this->super_STBase)._vptr_STBase[4])();
  if (SVar1 == SVar3) {
    Serializer::add8(s,this->value_);
    return;
  }
  __assert_fail("fName->fieldType == getSType ()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STInteger.h"
                ,0x46,"virtual void jbcoin::STInteger<unsigned char>::add(Serializer &) const");
}

Assistant:

void
    add (Serializer& s) const override
    {
        assert (fName->isBinary ());
        assert (fName->fieldType == getSType ());
        s.addInteger (value_);
    }